

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MySEQOutput.h
# Opt level: O3

void MySEQOutput::displayOffset(string *offsetName,DWORD offsetValue)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(offsetName->_M_dataplus)._M_p,
                      offsetName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=0x",3);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void displayOffset(std::string offsetName, DWORD offsetValue)
	{
		std::cout << offsetName << "=0x" << std::hex << offsetValue << std::endl;
	}